

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamToolsIndex_p.cpp
# Opt level: O0

void __thiscall
BamTools::Internal::BamToolsIndex::WriteBlocks(BamToolsIndex *this,BtiBlockVector *blocks)

{
  bool bVar1;
  const_iterator __lhs;
  vector<BamTools::Internal::BtiBlock,_std::allocator<BamTools::Internal::BtiBlock>_> *in_RDI;
  const_iterator blockEnd;
  const_iterator blockIter;
  BtiBlock *in_stack_00000078;
  BamToolsIndex *in_stack_00000080;
  __normal_iterator<const_BamTools::Internal::BtiBlock_*,_std::vector<BamTools::Internal::BtiBlock,_std::allocator<BamTools::Internal::BtiBlock>_>_>
  local_18 [3];
  
  local_18[0]._M_current =
       (BtiBlock *)
       std::vector<BamTools::Internal::BtiBlock,_std::allocator<BamTools::Internal::BtiBlock>_>::
       begin(in_RDI);
  __lhs = std::vector<BamTools::Internal::BtiBlock,_std::allocator<BamTools::Internal::BtiBlock>_>::
          end(in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_BamTools::Internal::BtiBlock_*,_std::vector<BamTools::Internal::BtiBlock,_std::allocator<BamTools::Internal::BtiBlock>_>_>
                        *)__lhs._M_current,
                       (__normal_iterator<const_BamTools::Internal::BtiBlock_*,_std::vector<BamTools::Internal::BtiBlock,_std::allocator<BamTools::Internal::BtiBlock>_>_>
                        *)in_RDI);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_BamTools::Internal::BtiBlock_*,_std::vector<BamTools::Internal::BtiBlock,_std::allocator<BamTools::Internal::BtiBlock>_>_>
    ::operator*(local_18);
    WriteBlock(in_stack_00000080,in_stack_00000078);
    __gnu_cxx::
    __normal_iterator<const_BamTools::Internal::BtiBlock_*,_std::vector<BamTools::Internal::BtiBlock,_std::allocator<BamTools::Internal::BtiBlock>_>_>
    ::operator++(local_18);
  }
  return;
}

Assistant:

void BamToolsIndex::WriteBlocks(const BtiBlockVector& blocks) {
    BtiBlockVector::const_iterator blockIter = blocks.begin();
    BtiBlockVector::const_iterator blockEnd  = blocks.end();
    for ( ; blockIter != blockEnd; ++blockIter )
        WriteBlock(*blockIter);
}